

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

uint Catch::rngSeed(void)

{
  uint uVar1;
  Context *this;
  IConfig *pIVar2;
  
  this = getCurrentContext();
  pIVar2 = Context::getConfig(this);
  uVar1 = (*pIVar2->_vptr_IConfig[0x11])();
  return uVar1;
}

Assistant:

unsigned int rngSeed() {
        return getCurrentContext().getConfig()->rngSeed();
    }